

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeInsertCell(Rtree *pRtree,RtreeNode *pNode,RtreeCell *pCell)

{
  int iVar1;
  int iVar2;
  RtreeNode *in_RDX;
  Rtree *in_RSI;
  long in_RDI;
  int nMaxCell;
  int nCell;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = (*(int *)(in_RDI + 0x20) + -4) / (int)(uint)*(byte *)(in_RDI + 0x27);
  iVar2 = readInt16((u8 *)((long)&in_RSI->db->pVfs + 2));
  if (iVar2 < iVar1) {
    nodeOverwriteCell(in_RSI,in_RDX,(RtreeCell *)CONCAT44(iVar2,iVar1),in_stack_ffffffffffffffdc);
    writeInt16((u8 *)((long)&in_RSI->db->pVfs + 2),iVar2 + 1);
    *(undefined4 *)((long)&(in_RSI->base).zErrMsg + 4) = 1;
  }
  return (int)(iVar2 == iVar1);
}

Assistant:

static int nodeInsertCell(
  Rtree *pRtree,                /* The overall R-Tree */
  RtreeNode *pNode,             /* Write new cell into this node */
  RtreeCell *pCell              /* The cell to be inserted */
){
  int nCell;                    /* Current number of cells in pNode */
  int nMaxCell;                 /* Maximum number of cells for pNode */

  nMaxCell = (pRtree->iNodeSize-4)/pRtree->nBytesPerCell;
  nCell = NCELL(pNode);

  assert( nCell<=nMaxCell );
  if( nCell<nMaxCell ){
    nodeOverwriteCell(pRtree, pNode, pCell, nCell);
    writeInt16(&pNode->zData[2], nCell+1);
    pNode->isDirty = 1;
  }

  return (nCell==nMaxCell);
}